

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

bool __thiscall imrt::Station::canReduceIntensity(Station *this,int beam)

{
  bool bVar1;
  reference pvVar2;
  undefined4 in_ESI;
  long in_RDI;
  int i;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x40) <= iVar3) {
      return false;
    }
    bVar1 = isOpenBeamlet((Station *)CONCAT44(in_ESI,iVar3),(int)((ulong)in_RDI >> 0x20),(int)in_RDI
                         );
    if ((bVar1) &&
       (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),(long)iVar3),
       0.0 < *pvVar2)) break;
    iVar3 = iVar3 + 1;
  }
  return true;
}

Assistant:

bool Station::canReduceIntensity(int beam){
    for (int i =0;i<max_apertures;i++)
      if (isOpenBeamlet(beam,i) && intensity[i]>0) return(true);
    return(false);
  }